

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlock.h
# Opt level: O0

int __thiscall dg::BBlock<dg::LLVMNode>::remove(BBlock<dg::LLVMNode> *this,char *__filename)

{
  bool bVar1;
  BBlock<dg::LLVMNode> *pBVar2;
  reference ppLVar3;
  BBlock<dg::LLVMNode> *extraout_RAX;
  LLVMNode *n;
  iterator __end0;
  iterator __begin0;
  list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *__range3;
  BBlock<dg::LLVMNode> *in_stack_000000d0;
  LLVMNode *in_stack_ffffffffffffffb8;
  LLVMNode *in_stack_ffffffffffffffc0;
  LLVMNode *this_00;
  _Self local_28;
  iterator in_stack_ffffffffffffffe0;
  
  isolate(in_stack_000000d0);
  if (this->dg != (DependenceGraphT *)0x0) {
    DependenceGraph<dg::LLVMNode>::removeBlock
              ((DependenceGraph<dg::LLVMNode> *)in_stack_ffffffffffffffc0,
               (KeyT)in_stack_ffffffffffffffb8);
    pBVar2 = DependenceGraph<dg::LLVMNode>::getEntryBB((DependenceGraph<dg::LLVMNode> *)this->dg);
    if (pBVar2 == this) {
      DependenceGraph<dg::LLVMNode>::setEntryBB
                ((DependenceGraph<dg::LLVMNode> *)this->dg,(BBlock<dg::LLVMNode> *)0x0);
    }
  }
  if (((ulong)__filename & 1) != 0) {
    in_stack_ffffffffffffffe0 =
         std::__cxx11::list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::begin
                   ((list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)
                    in_stack_ffffffffffffffb8);
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::end
                   ((list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)
                    in_stack_ffffffffffffffb8);
    while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,&local_28), bVar1) {
      ppLVar3 = std::_List_iterator<dg::LLVMNode_*>::operator*
                          ((_List_iterator<dg::LLVMNode_*> *)0x1cf2a3);
      this_00 = *ppLVar3;
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::setBasicBlock
                (&this_00->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,
                 (BBlock<dg::LLVMNode> *)0x0);
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::removeCDs
                (&in_stack_ffffffffffffffc0->
                  super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>);
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::removeDDs
                (&in_stack_ffffffffffffffc0->
                  super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>);
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getDG
                (&this_00->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>);
      DependenceGraph<dg::LLVMNode>::removeNode
                ((DependenceGraph<dg::LLVMNode> *)in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffc0 = this_00;
      if (this_00 != (LLVMNode *)0x0) {
        LLVMNode::~LLVMNode(this_00);
        operator_delete(this_00,0x1f0);
        in_stack_ffffffffffffffc0 = this_00;
      }
      std::_List_iterator<dg::LLVMNode_*>::operator++
                ((_List_iterator<dg::LLVMNode_*> *)&stack0xffffffffffffffe0);
    }
  }
  if (this != (BBlock<dg::LLVMNode> *)0x0) {
    ~BBlock((BBlock<dg::LLVMNode> *)in_stack_ffffffffffffffe0._M_node);
    operator_delete(this,0x208);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void remove(bool with_nodes = true) {
        // do not leave any dangling reference
        isolate();

        if (dg) {
#ifndef NDEBUG
            bool ret =
#endif
                    dg->removeBlock(key);
            assert(ret && "BUG: block was not in DG");
            if (dg->getEntryBB() == this)
                dg->setEntryBB(nullptr);
        }

        if (with_nodes) {
            for (NodeT *n : nodes) {
                // we must set basic block to nullptr
                // otherwise the node will try to remove the
                // basic block again if it is of size 1
                n->setBasicBlock(nullptr);

                // remove dependency edges, let be CFG edges
                // as we'll destroy all the nodes
                n->removeCDs();
                n->removeDDs();
                // remove the node from dg
                assert(n->getDG());
                n->getDG()->removeNode(n);

                delete n;
            }
        }

        delete this;
    }